

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O1

bool __thiscall
TgBot::Api::answerInlineQuery
          (Api *this,string *inlineQueryId,
          vector<std::shared_ptr<TgBot::InlineQueryResult>,_std::allocator<std::shared_ptr<TgBot::InlineQueryResult>_>_>
          *results,int32_t cacheTime,bool isPersonal,string *nextOffset,string *switchPmText,
          string *switchPmParameter)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  optional<bool> oVar2;
  string resultsJson;
  bool local_dd;
  int32_t local_dc;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> local_d8;
  string local_c0;
  string local_a0;
  path_type local_80;
  ptree local_50;
  
  local_d8.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_dd = isPersonal;
  local_dc = cacheTime;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve(&local_d8,7);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[16],std::__cxx11::string_const&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_d8,
             (char (*) [16])"inline_query_id",inlineQueryId);
  TgTypeParser::parseArray<TgBot::InlineQueryResult>
            (&local_a0,(TgTypeParser *)&this->field_0x28,0x1c8212,
             (vector<std::shared_ptr<TgBot::InlineQueryResult>,_std::allocator<std::shared_ptr<TgBot::InlineQueryResult>_>_>
              *)0x0);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],std::__cxx11::string&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_d8,
             (char (*) [8])"results",&local_a0);
  if (local_dc != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[11],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_d8,
               (char (*) [11])"cache_time",&local_dc);
  }
  if (local_dd == true) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[12],bool&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_d8,
               (char (*) [12])"is_personal",&local_dd);
  }
  if (nextOffset->_M_string_length != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[12],std::__cxx11::string_const&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_d8,
               (char (*) [12])"next_offset",nextOffset);
  }
  if (switchPmText->_M_string_length != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[15],std::__cxx11::string_const&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_d8,
               (char (*) [15])"switch_pm_text",switchPmText);
  }
  if (switchPmParameter->_M_string_length != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[20],std::__cxx11::string_const&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_d8,
               (char (*) [20])"switch_pm_parameter",switchPmParameter);
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"answerInlineQuery","");
  sendRequest(&local_50,this,&local_c0,&local_d8);
  paVar1 = &local_80.m_value.field_2;
  local_80.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
  local_80.m_separator = '.';
  local_80.m_start._M_current = local_80.m_value._M_dataplus._M_p;
  oVar2 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<bool>(&local_50,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_80.m_value._M_dataplus._M_p);
  }
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector(&local_d8);
  return (bool)(oVar2.super_type.m_storage & oVar2.super_type.m_initialized & 1);
}

Assistant:

bool Api::answerInlineQuery(const string& inlineQueryId, const std::vector<InlineQueryResult::Ptr>& results,
                            int32_t cacheTime, bool isPersonal, const string& nextOffset, const string& switchPmText, const string& switchPmParameter) const {
    vector<HttpReqArg> args;
    args.reserve(7);
    args.emplace_back("inline_query_id", inlineQueryId);
    string resultsJson = _tgTypeParser.parseArray<InlineQueryResult>(&TgTypeParser::parseInlineQueryResult, results);
    args.emplace_back("results", resultsJson);
    if (cacheTime) {
        args.emplace_back("cache_time", cacheTime);
    }
    if (isPersonal) {
        args.emplace_back("is_personal", isPersonal);
    }
    if (!nextOffset.empty()) {
        args.emplace_back("next_offset", nextOffset);
    }
    if (!switchPmText.empty()) {
        args.emplace_back("switch_pm_text", switchPmText);
    }
    if (!switchPmParameter.empty()) {
        args.emplace_back("switch_pm_parameter", switchPmParameter);
    }
    return sendRequest("answerInlineQuery", args).get<bool>("", false);
}